

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeTriang>::ComputeSolutionHCurlT<double>
          (TPZCompElHCurl<pzshape::TPZShapeTriang> *this,TPZFMatrix<double> *phiHCurl,
          TPZFMatrix<double> *curlPhi,TPZSolVec<double> *sol,TPZSolVec<double> *curlSol)

{
  double dVar1;
  uint uVar2;
  TPZManVector<double,_10> *pTVar3;
  TNode *pTVar4;
  int iVar5;
  long *plVar6;
  TPZCompMesh *pTVar7;
  TPZFMatrix<double> *this_00;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int coord;
  long lVar12;
  long col;
  long iSol;
  long col_00;
  bool bVar13;
  double dVar14;
  double extraout_XMM0_Qa;
  double local_70;
  TPZCompMesh *local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  TPZFMatrix<double> *local_48;
  long local_40;
  TPZFMatrix<double> *local_38;
  
  local_48 = curlPhi;
  local_38 = phiHCurl;
  plVar6 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                          super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                          super_TPZCompEl + 0xb8))();
  (**(code **)(*plVar6 + 0x78))(plVar6);
  iVar5 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x90))(this);
  pTVar7 = TPZCompEl::Mesh((TPZCompEl *)this);
  this_00 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar7->fSolution);
  lVar10 = (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  (*(sol->super_TPZVec<TPZManVector<double,_10>_>)._vptr_TPZVec[3])(sol,lVar10);
  (*(curlSol->super_TPZVec<TPZManVector<double,_10>_>)._vptr_TPZVec[3])(curlSol);
  lVar12 = 0;
  if (lVar10 < 1) {
    lVar10 = lVar12;
  }
  local_40 = lVar10;
  while (bVar13 = lVar10 != 0, lVar10 = lVar10 + -1, bVar13) {
    pTVar3 = (sol->super_TPZVec<TPZManVector<double,_10>_>).fStore;
    (**(code **)(*(long *)((long)pTVar3->fExtAlloc + lVar12 + -0x20) + 0x18))
              ((long)pTVar3->fExtAlloc + lVar12 + -0x20,2);
    local_70 = 0.0;
    TPZVec<double>::Fill
              ((TPZVec<double> *)
               ((long)((sol->super_TPZVec<TPZManVector<double,_10>_>).fStore)->fExtAlloc +
               lVar12 + -0x20),&local_70,0,-1);
    pTVar3 = (curlSol->super_TPZVec<TPZManVector<double,_10>_>).fStore;
    (**(code **)(*(long *)((long)pTVar3->fExtAlloc + lVar12 + -0x20) + 0x18))
              ((long)pTVar3->fExtAlloc + lVar12 + -0x20,1);
    local_70 = 0.0;
    TPZVec<double>::Fill
              ((TPZVec<double> *)
               ((long)((curlSol->super_TPZVec<TPZManVector<double,_10>_>).fStore)->fExtAlloc +
               lVar12 + -0x20),&local_70,0,-1);
    lVar12 = lVar12 + 0x70;
  }
  local_68 = TPZCompEl::Mesh((TPZCompEl *)this);
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  lVar10 = 0;
  for (iVar11 = 0; iVar11 != iVar5; iVar11 = iVar11 + 1) {
    lVar12 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                    super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                    super_TPZCompEl + 0xa8))();
    pTVar4 = (local_68->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
    uVar2 = pTVar4[*(int *)(lVar12 + 8)].dim;
    local_60 = (long)pTVar4[*(int *)(lVar12 + 8)].pos;
    lVar10 = (long)(int)lVar10;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    local_58 = (ulong)uVar2;
    uVar9 = 0;
    while (uVar9 != local_58) {
      lVar12 = uVar9 + local_60;
      local_50 = uVar9;
      for (col_00 = 0; col_00 != local_40; col_00 = col_00 + 1) {
        col = 0;
        while( true ) {
          pdVar8 = TPZFMatrix<double>::operator()(this_00,lVar12,col_00);
          dVar1 = *pdVar8;
          if (col == 2) break;
          dVar14 = TPZFMatrix<double>::operator()(local_38,lVar10,col);
          pdVar8 = (sol->super_TPZVec<TPZManVector<double,_10>_>).fStore[col_00].
                   super_TPZVec<double>.fStore;
          pdVar8[col] = dVar1 * dVar14 + pdVar8[col];
          col = col + 1;
        }
        (*(local_48->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x21])(local_48,0,lVar10);
        pdVar8 = (curlSol->super_TPZVec<TPZManVector<double,_10>_>).fStore[col_00].
                 super_TPZVec<double>.fStore;
        *pdVar8 = dVar1 * extraout_XMM0_Qa + *pdVar8;
      }
      lVar10 = lVar10 + 1;
      uVar9 = local_50 + 1;
    }
  }
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::ComputeSolutionHCurlT(
  const TPZFMatrix<REAL> &phiHCurl, const TPZFMatrix<REAL> &curlPhi,
    TPZSolVec<TVar> &sol, TPZSolVec<TVar> &curlSol)
{
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curlDim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nVar = this->Material()->NStateVariables();
    const int nConnects = this->NConnects();

    TPZFMatrix<TVar> &meshSol = this->Mesh()->Solution();

    long numberSol = meshSol.Cols();
#ifdef PZDEBUG
    if (numberSol != 1 || nVar != 1) {
        DebugStop();
    }
#endif

    sol.Resize(numberSol);
    curlSol.Resize(numberSol);

    for (long iSol = 0; iSol < numberSol; iSol++) {
        sol[iSol].Resize(dim);
        sol[iSol].Fill(0);
        curlSol[iSol].Resize(curlDim);
        curlSol[iSol].Fill(0);
    }

    TPZBlock &block = this->Mesh()->Block();
    int ishape = 0;
    for (int iCon = 0; iCon < nConnects; iCon++) {
        TPZConnect *con = &this->Connect(iCon);
        const auto conSeqN = con->SequenceNumber();
        const auto nShapeCon = block.Size(conSeqN);
        const auto pos = block.Position(conSeqN);

        for (int jShape = 0; jShape < nShapeCon; jShape++) {

            for (long iSol = 0; iSol < numberSol; iSol++) {
                for (int coord = 0; coord < dim; coord++) {
                    sol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * phiHCurl(ishape, coord);
                }
                for (int coord = 0; coord < curlDim; coord++) {
                    curlSol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * curlPhi.Get(coord, ishape);
                }
            }
            ishape++;
        }
    }
}